

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O0

void convolve_2d_sr_ver_4tap_avx2
               (int16_t *im_block,int32_t w,int32_t h,InterpFilterParams *filter_params_y,
               int32_t subpel_y_q4,uint8_t *dst,int32_t dst_stride)

{
  __m128i res_00;
  __m256i res_01;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int in_EDX;
  int in_ESI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  long in_R9;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  int in_stack_00000008;
  int16_t *s;
  __m256i r1 [4];
  __m256i r0 [4];
  __m256i tt_256_1 [2] [4];
  __m256i ss_256_3 [2] [4];
  __m256i s_256_3 [2] [4];
  int32_t x;
  __m256i r_2 [4];
  __m256i r_1 [4];
  __m256i tt_256 [4];
  __m256i ss_256_2 [4];
  __m256i s_256_2 [5];
  __m256i ss_256_1 [4];
  __m256i r [2];
  __m256i s_256_1 [4];
  __m256i res_1;
  __m256i ss_256 [2];
  __m256i s_256 [2];
  __m128i s_64 [4];
  __m256i coeffs_256 [2];
  __m128i res;
  __m128i src12;
  __m128i src01;
  __m128i ss_128 [2];
  __m128i s_32 [4];
  __m128i coeffs_128 [2];
  int32_t y;
  int16_t *im;
  __m256i *in_stack_ffffffffffffefc8;
  __m256i *in_stack_ffffffffffffefd0;
  __m256i *in_stack_ffffffffffffefd8;
  InterpFilterParams *in_stack_ffffffffffffefe0;
  __m256i *in_stack_ffffffffffffefe8;
  __m128i *in_stack_ffffffffffffeff0;
  __m256i *in_stack_ffffffffffffeff8;
  undefined4 in_stack_fffffffffffff000;
  int32_t in_stack_fffffffffffff004;
  InterpFilterParams *in_stack_fffffffffffff008;
  __m256i *in_stack_fffffffffffff010;
  __m256i *in_stack_fffffffffffff018;
  __m256i *in_stack_fffffffffffff020;
  __m128i *in_stack_fffffffffffff028;
  int16_t *in_stack_fffffffffffff030;
  undefined1 local_f20 [2] [32];
  undefined1 local_ee0 [32];
  undefined1 local_ea0 [2] [32];
  undefined1 local_e60 [32];
  undefined1 local_e20 [2] [32];
  undefined1 local_de0 [32];
  undefined1 local_da0 [2] [32];
  undefined1 local_d60 [32];
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  int local_c04;
  undefined1 local_b00 [32];
  undefined1 local_ac0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a40 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined1 local_960 [32];
  undefined1 local_920 [32];
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  ulong local_7c0;
  undefined8 uStack_7b8;
  ulong uStack_7b0;
  undefined8 uStack_7a8;
  ulong local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  ulong local_780;
  undefined8 uStack_778;
  ulong local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  ulong local_6a0;
  undefined8 uStack_698;
  ulong local_690;
  undefined8 uStack_688;
  ulong local_680;
  undefined8 uStack_678;
  int local_634;
  undefined1 (*local_630) [32];
  long local_628;
  int local_61c;
  int local_610;
  int local_60c;
  undefined1 local_600 [16];
  uint local_5e4;
  undefined1 local_5e0 [16];
  uint local_5c4;
  undefined1 local_5c0 [16];
  uint local_5a4;
  ulong local_5a0;
  undefined8 uStack_598;
  ulong local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  ulong local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  ulong local_4a0;
  undefined8 uStack_498;
  ulong uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 (*local_3b8) [32];
  undefined1 (*local_3b0) [32];
  undefined1 (*local_3a8) [32];
  undefined1 (*local_3a0) [32];
  undefined1 (*local_398) [32];
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 *local_378;
  ulong local_370;
  undefined8 uStack_368;
  ulong *local_358;
  ulong local_350;
  undefined8 uStack_348;
  undefined1 (*local_338) [32];
  ulong local_330;
  undefined8 uStack_328;
  ulong local_320;
  undefined8 uStack_318;
  ulong local_310;
  undefined8 uStack_308;
  ulong local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined1 (*local_2c8) [32];
  undefined1 (*local_2c0) [32];
  undefined8 *local_2b8;
  long local_2b0;
  undefined8 *local_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined1 (*local_188) [32];
  undefined1 (*local_180) [32];
  undefined8 *local_178;
  long local_170;
  undefined8 *local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  
  local_634 = in_EDX;
  local_630 = in_RDI;
  local_628 = in_R9;
  if (in_ESI == 2) {
    prepare_coeffs_4tap_sse2
              (in_stack_ffffffffffffefe0,(int32_t)((ulong)in_stack_ffffffffffffefd8 >> 0x20),
               (__m128i *)in_stack_ffffffffffffefd0);
    local_5a4 = *(uint *)*local_630;
    local_5c0._4_4_ = 0;
    local_5c0._0_4_ = local_5a4;
    local_6a0 = local_5c0._0_8_;
    uStack_698 = 0;
    local_5c4 = *(uint *)(*local_630 + 4);
    local_5e0._4_4_ = 0;
    local_5e0._0_4_ = local_5c4;
    local_690 = local_5e0._0_8_;
    uStack_688 = 0;
    local_5e4 = *(uint *)(*local_630 + 8);
    local_600._4_4_ = 0;
    local_600._0_4_ = local_5e4;
    local_680 = local_600._0_8_;
    uStack_678 = 0;
    local_300 = local_5c0._0_8_;
    uStack_2f8 = 0;
    local_310 = local_5e0._0_8_;
    uStack_308 = 0;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_5c0._0_8_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_5e0._0_8_;
    local_6d0 = vpunpckldq_avx(auVar5,auVar4);
    local_320 = local_5e0._0_8_;
    uStack_318 = 0;
    local_330 = local_600._0_8_;
    uStack_328 = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_5e0._0_8_;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_600._0_8_;
    local_6e0 = vpunpckldq_avx(auVar3,auVar21);
    local_2e0 = local_6d0._0_8_;
    uStack_2d8 = local_6d0._8_8_;
    local_2f0 = local_6e0._0_8_;
    uStack_2e8 = local_6e0._8_8_;
    local_6c0 = vpunpcklwd_avx(local_6d0,local_6e0);
    auVar23 = ZEXT1664(local_6c0);
    local_600 = ZEXT416(local_5e4);
    local_5e0 = ZEXT416(local_5c4);
    local_5c0 = ZEXT416(local_5a4);
    do {
      auVar21 = auVar23._0_16_;
      xy_y_convolve_4tap_2x2_sse2
                ((int16_t *)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000),
                 (__m128i *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
                 (__m128i *)in_stack_ffffffffffffefe8);
      auVar23 = ZEXT1664(auVar21);
      res_00[1] = (longlong)in_stack_ffffffffffffeff0;
      res_00[0] = (longlong)in_stack_ffffffffffffefe8;
      local_6f0 = auVar21;
      xy_y_round_store_2x2_sse2
                (res_00,(uint8_t *)in_stack_ffffffffffffefe0,(ptrdiff_t)in_stack_ffffffffffffefd8);
      local_630 = (undefined1 (*) [32])(*local_630 + 8);
      local_628 = local_628 + (in_stack_00000008 << 1);
      local_634 = local_634 + -2;
    } while (local_634 != 0);
  }
  else {
    local_61c = in_R8D;
    local_610 = in_EDX;
    local_60c = in_ESI;
    prepare_coeffs_4tap_avx2
              (in_stack_fffffffffffff008,in_stack_fffffffffffff004,in_stack_ffffffffffffeff8);
    if (local_60c == 4) {
      local_338 = local_630;
      local_7c0 = *(ulong *)*local_630;
      uStack_348 = 0;
      uStack_778 = 0;
      local_358 = (ulong *)(*local_630 + 8);
      uStack_7b0 = *local_358;
      uStack_368 = 0;
      uStack_768 = 0;
      local_378 = (undefined8 *)(*local_630 + 0x10);
      uStack_790 = *local_378;
      uStack_388 = 0;
      uStack_758 = 0;
      uStack_588 = 0;
      uStack_7a8 = 0;
      uStack_7b8 = 0;
      uStack_598 = 0;
      uStack_788 = 0;
      uStack_798 = 0;
      uStack_498 = 0;
      uStack_488 = 0;
      uStack_4b8 = 0;
      uStack_4a8 = 0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_7c0;
      auVar2._16_8_ = uStack_7b0;
      auVar2._24_8_ = 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uStack_7b0;
      auVar1._16_8_ = uStack_790;
      auVar1._24_8_ = 0;
      local_800 = vpunpcklwd_avx2(auVar2,auVar1);
      auVar23 = ZEXT3264(local_800);
      local_7a0 = uStack_7b0;
      local_780 = local_7c0;
      local_770 = uStack_7b0;
      local_760 = uStack_790;
      local_5a0 = uStack_7b0;
      local_590 = local_7c0;
      local_4c0 = uStack_7b0;
      uStack_4b0 = uStack_790;
      local_4a0 = local_7c0;
      uStack_490 = uStack_7b0;
      local_390 = uStack_790;
      local_370 = uStack_7b0;
      local_350 = local_7c0;
      do {
        auVar22 = auVar23._0_32_;
        xy_y_convolve_4tap_4x2_avx2
                  (in_stack_fffffffffffff030,in_stack_fffffffffffff028,in_stack_fffffffffffff020,
                   in_stack_fffffffffffff018);
        auVar23 = ZEXT3264(auVar22);
        res_01[1] = (longlong)in_stack_fffffffffffff020;
        res_01[0] = (longlong)in_stack_fffffffffffff018;
        res_01[2] = (longlong)in_stack_fffffffffffff028;
        res_01[3] = (longlong)in_stack_fffffffffffff030;
        local_820 = auVar22;
        xy_y_round_store_4x2_avx2
                  (res_01,(uint8_t *)in_stack_fffffffffffff010,(ptrdiff_t)in_stack_fffffffffffff008)
        ;
        local_630 = (undefined1 (*) [32])(*local_630 + 0x10);
        local_628 = local_628 + (in_stack_00000008 << 1);
        local_634 = local_634 + -2;
      } while (local_634 != 0);
    }
    else if (local_60c == 8) {
      local_398 = local_630;
      local_8a0 = *(undefined8 *)*local_630;
      uStack_898 = *(undefined8 *)(*local_630 + 8);
      uStack_890 = *(undefined8 *)(*local_630 + 0x10);
      uStack_888 = *(undefined8 *)(*local_630 + 0x18);
      local_3a0 = (undefined1 (*) [32])(*local_630 + 0x10);
      local_880 = *(undefined8 *)*local_3a0;
      uStack_878 = *(undefined8 *)(*local_630 + 0x18);
      uStack_870 = *(undefined8 *)local_630[1];
      uStack_868 = *(undefined8 *)(local_630[1] + 8);
      if (local_61c == 8) {
        do {
          xy_y_convolve_4tap_8x2_half_pel_avx2
                    ((int16_t *)in_stack_fffffffffffff020,in_stack_fffffffffffff018,
                     in_stack_fffffffffffff010,(__m256i *)in_stack_fffffffffffff008);
          xy_y_round_store_8x2_avx2
                    ((__m256i *)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000),
                     (uint8_t *)in_stack_ffffffffffffeff8,(ptrdiff_t)in_stack_ffffffffffffeff0);
          local_630 = local_630 + 1;
          local_628 = local_628 + (in_stack_00000008 << 1);
          local_634 = local_634 + -2;
        } while (local_634 != 0);
      }
      else {
        local_960 = vpunpcklwd_avx2(*local_630,*local_3a0);
        local_920 = vpunpckhwd_avx2(*local_630,*local_3a0);
        local_500 = local_880;
        uStack_4f8 = uStack_878;
        uStack_4f0 = uStack_870;
        uStack_4e8 = uStack_868;
        local_4e0 = local_8a0;
        uStack_4d8 = uStack_898;
        uStack_4d0 = uStack_890;
        uStack_4c8 = uStack_888;
        local_400 = local_880;
        uStack_3f8 = uStack_878;
        uStack_3f0 = uStack_870;
        uStack_3e8 = uStack_868;
        local_3e0 = local_8a0;
        uStack_3d8 = uStack_898;
        uStack_3d0 = uStack_890;
        uStack_3c8 = uStack_888;
        do {
          xy_y_convolve_4tap_8x2_avx2
                    ((int16_t *)in_stack_fffffffffffff010,(__m256i *)in_stack_fffffffffffff008,
                     (__m256i *)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000),
                     in_stack_ffffffffffffeff8);
          xy_y_round_store_8x2_avx2
                    ((__m256i *)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000),
                     (uint8_t *)in_stack_ffffffffffffeff8,(ptrdiff_t)in_stack_ffffffffffffeff0);
          local_630 = local_630 + 1;
          local_628 = local_628 + (in_stack_00000008 << 1);
          local_634 = local_634 + -2;
        } while (local_634 != 0);
      }
    }
    else if (local_60c == 0x10) {
      local_3a8 = local_630;
      local_a00 = *(undefined8 *)*local_630;
      uStack_9f8 = *(undefined8 *)(*local_630 + 8);
      uStack_9f0 = *(undefined8 *)(*local_630 + 0x10);
      uStack_9e8 = *(undefined8 *)(*local_630 + 0x18);
      local_3b0 = local_630 + 1;
      local_9e0 = *(undefined8 *)*local_3b0;
      uStack_9d8 = *(undefined8 *)(local_630[1] + 8);
      uStack_9d0 = *(undefined8 *)(local_630[1] + 0x10);
      uStack_9c8 = *(undefined8 *)(local_630[1] + 0x18);
      local_3b8 = local_630 + 2;
      local_9c0 = *(undefined8 *)*local_3b8;
      uStack_9b8 = *(undefined8 *)(local_630[2] + 8);
      uStack_9b0 = *(undefined8 *)(local_630[2] + 0x10);
      uStack_9a8 = *(undefined8 *)(local_630[2] + 0x18);
      if (local_61c == 8) {
        do {
          xy_y_convolve_4tap_16x2_half_pelavx2
                    ((int16_t *)in_stack_fffffffffffff020,in_stack_fffffffffffff018,
                     in_stack_fffffffffffff010,(__m256i *)in_stack_fffffffffffff008);
          xy_y_round_store_16x2_avx2
                    (in_stack_fffffffffffff020,(uint8_t *)in_stack_fffffffffffff018,
                     (ptrdiff_t)in_stack_fffffffffffff010);
          local_630 = local_630 + 2;
          local_628 = local_628 + (in_stack_00000008 << 1);
          local_634 = local_634 + -2;
        } while (local_634 != 0);
      }
      else {
        local_a80 = vpunpcklwd_avx2(*local_630,*local_3b0);
        local_a40 = vpunpckhwd_avx2(*local_630,*local_3b0);
        local_b00 = vpunpcklwd_avx2(*local_3b0,*local_3b8);
        local_ac0 = vpunpckhwd_avx2(*local_3b0,*local_3b8);
        local_580 = local_9c0;
        uStack_578 = uStack_9b8;
        uStack_570 = uStack_9b0;
        uStack_568 = uStack_9a8;
        local_560 = local_9e0;
        uStack_558 = uStack_9d8;
        uStack_550 = uStack_9d0;
        uStack_548 = uStack_9c8;
        local_540 = local_9e0;
        uStack_538 = uStack_9d8;
        uStack_530 = uStack_9d0;
        uStack_528 = uStack_9c8;
        local_520 = local_a00;
        uStack_518 = uStack_9f8;
        uStack_510 = uStack_9f0;
        uStack_508 = uStack_9e8;
        local_480 = local_9c0;
        uStack_478 = uStack_9b8;
        uStack_470 = uStack_9b0;
        uStack_468 = uStack_9a8;
        local_460 = local_9e0;
        uStack_458 = uStack_9d8;
        uStack_450 = uStack_9d0;
        uStack_448 = uStack_9c8;
        local_440 = local_9e0;
        uStack_438 = uStack_9d8;
        uStack_430 = uStack_9d0;
        uStack_428 = uStack_9c8;
        local_420 = local_a00;
        uStack_418 = uStack_9f8;
        uStack_410 = uStack_9f0;
        uStack_408 = uStack_9e8;
        do {
          xy_y_convolve_4tap_16x2_avx2
                    ((int16_t *)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8,
                     (__m256i *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8,
                     in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
          xy_y_round_store_16x2_avx2
                    (in_stack_fffffffffffff020,(uint8_t *)in_stack_fffffffffffff018,
                     (ptrdiff_t)in_stack_fffffffffffff010);
          local_630 = local_630 + 2;
          local_628 = local_628 + (in_stack_00000008 << 1);
          local_634 = local_634 + -2;
        } while (local_634 != 0);
      }
    }
    else {
      local_c04 = 0;
      do {
        local_168 = (undefined8 *)(*local_630 + (long)local_c04 * 2);
        local_170 = (long)local_60c;
        local_178 = &local_d20;
        local_180 = local_e20;
        local_188 = local_f20;
        local_40 = (undefined8 *)((long)local_168 + local_170 * 2);
        local_48 = (undefined8 *)((long)local_168 + local_170 * 4);
        local_100 = local_d20;
        uStack_f8 = uStack_d18;
        uStack_f0 = uStack_d10;
        uStack_e8 = uStack_d08;
        auVar22._8_8_ = uStack_d18;
        auVar22._0_8_ = local_d20;
        auVar22._16_8_ = uStack_d10;
        auVar22._24_8_ = uStack_d08;
        local_120 = local_d00;
        uStack_118 = uStack_cf8;
        uStack_110 = uStack_cf0;
        uStack_108 = uStack_ce8;
        auVar6._8_8_ = uStack_cf8;
        auVar6._0_8_ = local_d00;
        auVar6._16_8_ = uStack_cf0;
        auVar6._24_8_ = uStack_ce8;
        local_e20[0] = vpunpcklwd_avx2(auVar22,auVar6);
        local_80 = local_d20;
        uStack_78 = uStack_d18;
        uStack_70 = uStack_d10;
        uStack_68 = uStack_d08;
        auVar9._8_8_ = uStack_d18;
        auVar9._0_8_ = local_d20;
        auVar9._16_8_ = uStack_d10;
        auVar9._24_8_ = uStack_d08;
        local_a0 = local_d00;
        uStack_98 = uStack_cf8;
        uStack_90 = uStack_cf0;
        uStack_88 = uStack_ce8;
        auVar10._8_8_ = uStack_cf8;
        auVar10._0_8_ = local_d00;
        auVar10._16_8_ = uStack_cf0;
        auVar10._24_8_ = uStack_ce8;
        local_de0 = vpunpckhwd_avx2(auVar9,auVar10);
        local_140 = local_d00;
        uStack_138 = uStack_cf8;
        uStack_130 = uStack_cf0;
        uStack_128 = uStack_ce8;
        auVar13._8_8_ = uStack_cf8;
        auVar13._0_8_ = local_d00;
        auVar13._16_8_ = uStack_cf0;
        auVar13._24_8_ = uStack_ce8;
        local_160 = local_ce0;
        uStack_158 = uStack_cd8;
        uStack_150 = uStack_cd0;
        uStack_148 = uStack_cc8;
        auVar14._8_8_ = uStack_cd8;
        auVar14._0_8_ = local_ce0;
        auVar14._16_8_ = uStack_cd0;
        auVar14._24_8_ = uStack_cc8;
        local_f20[0] = vpunpcklwd_avx2(auVar13,auVar14);
        local_c0 = local_d00;
        uStack_b8 = uStack_cf8;
        uStack_b0 = uStack_cf0;
        uStack_a8 = uStack_ce8;
        auVar17._8_8_ = uStack_cf8;
        auVar17._0_8_ = local_d00;
        auVar17._16_8_ = uStack_cf0;
        auVar17._24_8_ = uStack_ce8;
        local_e0 = local_ce0;
        uStack_d8 = uStack_cd8;
        uStack_d0 = uStack_cd0;
        uStack_c8 = uStack_cc8;
        auVar18._8_8_ = uStack_cd8;
        auVar18._0_8_ = local_ce0;
        auVar18._16_8_ = uStack_cd0;
        auVar18._24_8_ = uStack_cc8;
        local_ee0 = vpunpckhwd_avx2(auVar17,auVar18);
        local_2a8 = local_168 + 4;
        local_2b0 = (long)local_60c;
        local_2b8 = &local_ca0;
        local_2c0 = local_da0;
        local_2c8 = local_ea0;
        local_198 = (undefined8 *)((long)local_2a8 + local_2b0 * 2);
        local_1a0 = (undefined8 *)((long)local_2a8 + local_2b0 * 4);
        local_240 = local_ca0;
        uStack_238 = uStack_c98;
        uStack_230 = uStack_c90;
        uStack_228 = uStack_c88;
        auVar7._8_8_ = uStack_c98;
        auVar7._0_8_ = local_ca0;
        auVar7._16_8_ = uStack_c90;
        auVar7._24_8_ = uStack_c88;
        local_260 = local_c80;
        uStack_258 = uStack_c78;
        uStack_250 = uStack_c70;
        uStack_248 = uStack_c68;
        auVar8._8_8_ = uStack_c78;
        auVar8._0_8_ = local_c80;
        auVar8._16_8_ = uStack_c70;
        auVar8._24_8_ = uStack_c68;
        local_da0[0] = vpunpcklwd_avx2(auVar7,auVar8);
        local_1c0 = local_ca0;
        uStack_1b8 = uStack_c98;
        uStack_1b0 = uStack_c90;
        uStack_1a8 = uStack_c88;
        auVar11._8_8_ = uStack_c98;
        auVar11._0_8_ = local_ca0;
        auVar11._16_8_ = uStack_c90;
        auVar11._24_8_ = uStack_c88;
        local_1e0 = local_c80;
        uStack_1d8 = uStack_c78;
        uStack_1d0 = uStack_c70;
        uStack_1c8 = uStack_c68;
        auVar12._8_8_ = uStack_c78;
        auVar12._0_8_ = local_c80;
        auVar12._16_8_ = uStack_c70;
        auVar12._24_8_ = uStack_c68;
        local_d60 = vpunpckhwd_avx2(auVar11,auVar12);
        local_280 = local_c80;
        uStack_278 = uStack_c78;
        uStack_270 = uStack_c70;
        uStack_268 = uStack_c68;
        auVar15._8_8_ = uStack_c78;
        auVar15._0_8_ = local_c80;
        auVar15._16_8_ = uStack_c70;
        auVar15._24_8_ = uStack_c68;
        local_2a0 = local_c60;
        uStack_298 = uStack_c58;
        uStack_290 = uStack_c50;
        uStack_288 = uStack_c48;
        auVar16._8_8_ = uStack_c58;
        auVar16._0_8_ = local_c60;
        auVar16._16_8_ = uStack_c50;
        auVar16._24_8_ = uStack_c48;
        local_ea0[0] = vpunpcklwd_avx2(auVar15,auVar16);
        local_200 = local_c80;
        uStack_1f8 = uStack_c78;
        uStack_1f0 = uStack_c70;
        uStack_1e8 = uStack_c68;
        auVar19._8_8_ = uStack_c78;
        auVar19._0_8_ = local_c80;
        auVar19._16_8_ = uStack_c70;
        auVar19._24_8_ = uStack_c68;
        local_220 = local_c60;
        uStack_218 = uStack_c58;
        uStack_210 = uStack_c50;
        uStack_208 = uStack_c48;
        auVar20._8_8_ = uStack_c58;
        auVar20._0_8_ = local_c60;
        auVar20._16_8_ = uStack_c50;
        auVar20._24_8_ = uStack_c48;
        local_e60 = vpunpckhwd_avx2(auVar19,auVar20);
        local_634 = local_610;
        local_190 = local_2a8;
        local_38 = local_168;
        local_d20 = *local_168;
        uStack_d18 = local_168[1];
        uStack_d10 = local_168[2];
        uStack_d08 = local_168[3];
        local_ca0 = *local_2a8;
        uStack_c98 = local_168[5];
        uStack_c90 = local_168[6];
        uStack_c88 = local_168[7];
        local_d00 = *local_40;
        uStack_cf8 = local_40[1];
        uStack_cf0 = local_40[2];
        uStack_ce8 = local_40[3];
        local_c80 = *local_198;
        uStack_c78 = local_198[1];
        uStack_c70 = local_198[2];
        uStack_c68 = local_198[3];
        local_ce0 = *local_48;
        uStack_cd8 = local_48[1];
        uStack_cd0 = local_48[2];
        uStack_cc8 = local_48[3];
        local_c60 = *local_1a0;
        uStack_c58 = local_1a0[1];
        uStack_c50 = local_1a0[2];
        uStack_c48 = local_1a0[3];
        do {
          xy_y_convolve_4tap_32x2_avx2();
          xy_y_convolve_4tap_32x2_avx2();
          xy_y_round_store_32_avx2
                    (in_stack_fffffffffffff020,in_stack_fffffffffffff018,
                     (uint8_t *)in_stack_fffffffffffff010);
          xy_y_round_store_32_avx2
                    (in_stack_fffffffffffff020,in_stack_fffffffffffff018,
                     (uint8_t *)in_stack_fffffffffffff010);
          local_634 = local_634 + -2;
        } while (local_634 != 0);
        local_c04 = local_c04 + 0x20;
      } while (local_c04 < local_60c);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_ver_4tap_avx2(
    const int16_t *const im_block, const int32_t w, const int32_t h,
    const InterpFilterParams *const filter_params_y, const int32_t subpel_y_q4,
    uint8_t *dst, const int32_t dst_stride) {
  const int16_t *im = im_block;
  int32_t y = h;

  if (w == 2) {
    __m128i coeffs_128[2], s_32[4], ss_128[2];

    prepare_coeffs_4tap_sse2(filter_params_y, subpel_y_q4, coeffs_128);

    s_32[0] = _mm_cvtsi32_si128(*(int32_t *)(im + 0 * 2));
    s_32[1] = _mm_cvtsi32_si128(*(int32_t *)(im + 1 * 2));
    s_32[2] = _mm_cvtsi32_si128(*(int32_t *)(im + 2 * 2));

    const __m128i src01 = _mm_unpacklo_epi32(s_32[0], s_32[1]);
    const __m128i src12 = _mm_unpacklo_epi32(s_32[1], s_32[2]);

    ss_128[0] = _mm_unpacklo_epi16(src01, src12);

    do {
      const __m128i res =
          xy_y_convolve_4tap_2x2_sse2(im, s_32, ss_128, coeffs_128);
      xy_y_round_store_2x2_sse2(res, dst, dst_stride);
      im += 2 * 2;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else {
    __m256i coeffs_256[2];

    prepare_coeffs_4tap_avx2(filter_params_y, subpel_y_q4, coeffs_256);

    if (w == 4) {
      __m128i s_64[4];
      __m256i s_256[2], ss_256[2];

      s_64[0] = _mm_loadl_epi64((__m128i *)(im + 0 * 4));
      s_64[1] = _mm_loadl_epi64((__m128i *)(im + 1 * 4));
      s_64[2] = _mm_loadl_epi64((__m128i *)(im + 2 * 4));

      // Load lines a and b. Line a to lower 128, line b to upper 128
      s_256[0] = _mm256_setr_m128i(s_64[0], s_64[1]);
      s_256[1] = _mm256_setr_m128i(s_64[1], s_64[2]);

      ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);

      do {
        const __m256i res =
            xy_y_convolve_4tap_4x2_avx2(im, s_64, ss_256, coeffs_256);
        xy_y_round_store_4x2_avx2(res, dst, dst_stride);
        im += 2 * 4;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 8) {
      __m256i s_256[4], r[2];

      s_256[0] = _mm256_loadu_si256((__m256i *)(im + 0 * 8));
      s_256[1] = _mm256_loadu_si256((__m256i *)(im + 1 * 8));

      if (subpel_y_q4 != 8) {
        __m256i ss_256[4];

        ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
        ss_256[2] = _mm256_unpackhi_epi16(s_256[0], s_256[1]);

        do {
          xy_y_convolve_4tap_8x2_avx2(im, ss_256, coeffs_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        do {
          xy_y_convolve_4tap_8x2_half_pel_avx2(im, coeffs_256, s_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else if (w == 16) {
      __m256i s_256[5];

      s_256[0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
      s_256[1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));
      s_256[2] = _mm256_loadu_si256((__m256i *)(im + 2 * 16));

      if (subpel_y_q4 != 8) {
        __m256i ss_256[4], tt_256[4], r[4];

        ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
        ss_256[2] = _mm256_unpackhi_epi16(s_256[0], s_256[1]);

        tt_256[0] = _mm256_unpacklo_epi16(s_256[1], s_256[2]);
        tt_256[2] = _mm256_unpackhi_epi16(s_256[1], s_256[2]);

        do {
          xy_y_convolve_4tap_16x2_avx2(im, s_256, ss_256, tt_256, coeffs_256,
                                       r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);
          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        __m256i r[4];

        do {
          xy_y_convolve_4tap_16x2_half_pelavx2(im, s_256, coeffs_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);
          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else {
      /*It's a special condition for OBMC. A/c  to Av1 spec 4-tap won't
      support for width(w)>16, but for OBMC while predicting above block
      it reduces size block to Wx(h/2), for example, if above block size
      is 32x8, we get block size as 32x4 for OBMC.*/
      int32_t x = 0;

      assert(!(w % 32));

      __m256i s_256[2][4], ss_256[2][4], tt_256[2][4], r0[4], r1[4];
      do {
        const int16_t *s = im + x;
        uint8_t *d = dst + x;

        loadu_unpack_16bit_3rows_avx2(s, w, s_256[0], ss_256[0], tt_256[0]);
        loadu_unpack_16bit_3rows_avx2(s + 16, w, s_256[1], ss_256[1],
                                      tt_256[1]);

        y = h;
        do {
          xy_y_convolve_4tap_32x2_avx2(s, w, s_256[0], ss_256[0], tt_256[0],
                                       coeffs_256, r0);
          xy_y_convolve_4tap_32x2_avx2(s + 16, w, s_256[1], ss_256[1],
                                       tt_256[1], coeffs_256, r1);

          xy_y_round_store_32_avx2(r0 + 0, r1 + 0, d);
          xy_y_round_store_32_avx2(r0 + 2, r1 + 2, d + dst_stride);

          s += 2 * w;
          d += 2 * dst_stride;
          y -= 2;
        } while (y);

        x += 32;
      } while (x < w);
    }
  }
}